

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O1

uint32_t dxil_spv::get_node_stride_from_annotate_handle(CallInst *inst)

{
  bool bVar1;
  ValueKind VVar2;
  uint32_t uVar3;
  Value *pVVar4;
  Instruction *this;
  ConstantAggregate *this_00;
  Constant *pCVar5;
  APInt *pAVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  LoggingCallback p_Var9;
  void *pvVar10;
  char acStack_1018 [4104];
  
  pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  bVar1 = value_is_dx_op_instrinsic(pVVar4,IndexNodeHandle);
  if (bVar1) {
    pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
    this = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar4);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)this);
    if (VVar2 != Call) {
      p_Var9 = get_thread_log_callback();
      if (p_Var9 == (LoggingCallback)0x0) {
        get_node_stride_from_annotate_handle();
        std::terminate();
      }
      goto LAB_001502e7;
    }
    pVVar4 = LLVMBC::Instruction::getOperand(this,1);
    inst = (CallInst *)LLVMBC::Internal::resolve_proxy(pVVar4);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)inst);
    if (VVar2 != Call) {
      p_Var9 = get_thread_log_callback();
      if (p_Var9 == (LoggingCallback)0x0) {
        get_node_stride_from_annotate_handle();
        std::terminate();
      }
      goto LAB_001502e7;
    }
  }
  pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
  this_00 = (ConstantAggregate *)LLVMBC::Internal::resolve_proxy(pVVar4);
  VVar2 = LLVMBC::Value::get_value_kind((Value *)this_00);
  if (VVar2 == ConstantAggregate) {
    pCVar5 = LLVMBC::ConstantAggregate::getOperand(this_00,0);
    pCVar5 = (Constant *)LLVMBC::Internal::resolve_proxy(&pCVar5->super_Value);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)pCVar5);
    if (VVar2 == ConstantInt) {
      pAVar6 = LLVMBC::Constant::getUniqueInteger(pCVar5);
      uVar7 = LLVMBC::APInt::getZExtValue(pAVar6);
      pCVar5 = LLVMBC::ConstantAggregate::getOperand(this_00,1);
      pCVar5 = (Constant *)LLVMBC::Internal::resolve_proxy(&pCVar5->super_Value);
      VVar2 = LLVMBC::Value::get_value_kind((Value *)pCVar5);
      if (VVar2 == ConstantInt) {
        pAVar6 = LLVMBC::Constant::getUniqueInteger(pCVar5);
        uVar8 = LLVMBC::APInt::getZExtValue(pAVar6);
        uVar3 = (uint32_t)uVar8;
        if (((uint)uVar7 >> 8 & 1) != 0) {
          uVar3 = ((uint32_t)uVar8 + 3 & 0xfffffffc) + 4;
        }
        return uVar3;
      }
      p_Var9 = get_thread_log_callback();
      if (p_Var9 == (LoggingCallback)0x0) {
        get_node_stride_from_annotate_handle();
        std::terminate();
      }
    }
    else {
      p_Var9 = get_thread_log_callback();
      if (p_Var9 == (LoggingCallback)0x0) {
        get_node_stride_from_annotate_handle();
        std::terminate();
      }
    }
  }
  else {
    p_Var9 = get_thread_log_callback();
    if (p_Var9 == (LoggingCallback)0x0) {
      get_node_stride_from_annotate_handle();
      std::terminate();
    }
  }
LAB_001502e7:
  builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
  builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
  pvVar10 = get_thread_log_callback_userdata();
  (*p_Var9)(pvVar10,Error,acStack_1018);
  std::terminate();
}

Assistant:

static uint32_t get_node_stride_from_annotate_handle(const llvm::CallInst *inst)
{
	// This is a red herring, since the flags are wrong. Gotta keep digging ... >_<
	if (value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::IndexNodeHandle))
	{
		auto *index_handle = llvm::cast<llvm::CallInst>(inst->getOperand(1));
		inst = llvm::cast<llvm::CallInst>(index_handle->getOperand(1));
	}

	auto *type_operand = llvm::cast<llvm::ConstantAggregate>(inst->getOperand(2));
	uint32_t node_io_flags = llvm::cast<llvm::ConstantInt>(type_operand->getOperand(0))->getUniqueInteger().getZExtValue();
	uint32_t stride = llvm::cast<llvm::ConstantInt>(type_operand->getOperand(1))->getUniqueInteger().getZExtValue();

	if ((node_io_flags & DXIL::NodeIOTrackRWInputSharingBit) != 0)
	{
		stride = (stride + 3u) & ~3u;
		stride += 4;
	}

	return stride;
}